

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chorus.cpp
# Opt level: O0

EffectState * __thiscall
anon_unknown.dwarf_101d8b::ChorusStateFactory::create(ChorusStateFactory *this)

{
  EffectState *__s;
  ChorusState *unaff_retaddr;
  size_t in_stack_fffffffffffffff0;
  
  __s = (EffectState *)(anonymous_namespace)::ChorusState::operator_new(in_stack_fffffffffffffff0);
  memset(__s,0,0x160);
  ChorusState::ChorusState(unaff_retaddr);
  return __s;
}

Assistant:

EffectState *create() override { return new ChorusState{}; }